

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCodeAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imf_3_3::KeyCode>::writeValueTo
          (TypedAttribute<Imf_3_3::KeyCode> *this,OStream *os,int version)

{
  OStream *in_RSI;
  long in_RDI;
  int v;
  OStream *in_stack_ffffffffffffffb0;
  
  KeyCode::filmMfcCode((KeyCode *)(in_RDI + 8));
  v = (int)((ulong)in_RSI >> 0x20);
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_stack_ffffffffffffffb0,v);
  KeyCode::filmType((KeyCode *)(in_RDI + 8));
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,v);
  KeyCode::prefix((KeyCode *)(in_RDI + 8));
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,v);
  KeyCode::count((KeyCode *)(in_RDI + 8));
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,v);
  KeyCode::perfOffset((KeyCode *)(in_RDI + 8));
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,v);
  KeyCode::perfsPerFrame((KeyCode *)(in_RDI + 8));
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,v);
  KeyCode::perfsPerCount((KeyCode *)(in_RDI + 8));
  Xdr::write<Imf_3_3::StreamIO,Imf_3_3::OStream>(in_RSI,v);
  return;
}

Assistant:

IMF_EXPORT void
KeyCodeAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.filmMfcCode ());
    Xdr::write<StreamIO> (os, _value.filmType ());
    Xdr::write<StreamIO> (os, _value.prefix ());
    Xdr::write<StreamIO> (os, _value.count ());
    Xdr::write<StreamIO> (os, _value.perfOffset ());
    Xdr::write<StreamIO> (os, _value.perfsPerFrame ());
    Xdr::write<StreamIO> (os, _value.perfsPerCount ());
}